

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O2

size_t __thiscall event_track::EventSample::size(EventSample *this)

{
  pointer pEVar1;
  size_t sVar2;
  uint uVar3;
  size_t l_size;
  size_t sVar4;
  pointer pEVar5;
  
  sVar4 = 8;
  if (this->is_emeb_ == false) {
    pEVar5 = (this->instance_boxes_).
             super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pEVar1 = (this->instance_boxes_).
             super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pEVar1 != pEVar5) {
      sVar4 = 0;
      for (uVar3 = 0; (ulong)uVar3 < (ulong)(((long)pEVar1 - (long)pEVar5) / 0xd8);
          uVar3 = uVar3 + 1) {
        sVar2 = EventMessageInstanceBox::size(pEVar5 + uVar3);
        sVar4 = sVar4 + (sVar2 & 0xffffffff);
        pEVar5 = (this->instance_boxes_).
                 super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pEVar1 = (this->instance_boxes_).
                 super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
  }
  return sVar4;
}

Assistant:

std::size_t size()
		{
			if(is_emeb_ || instance_boxes_.size() == 0)
			   return 8;
			else 
			{
				size_t l_size = 0;

				for (uint32_t k = 0; k < instance_boxes_.size(); k++)
					l_size += (uint32_t)instance_boxes_[k].size();

				return l_size;
			}   
		}